

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRackpinion.cpp
# Opt level: O3

void __thiscall chrono::ChLinkRackpinion::UpdateTime(ChLinkRackpinion *this,double mytime)

{
  undefined1 auVar1 [16];
  bool bVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double dVar27;
  ulong extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar28 [64];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  double dVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  ChFrame<double> abs_contact;
  ChMatrix33<double> mrot;
  ChMatrix33<double> ma1;
  ChFrame<double> mrotframe;
  ulong local_2f8;
  ulong uStack_2f0;
  ChFrame<double> local_2e0;
  ChFrame<double> local_258;
  ChFrame<double> local_1d0;
  undefined1 local_148 [56];
  double dStack_110;
  double local_108;
  ChMatrix33<double> local_100;
  ChFrame<double> local_b8;
  undefined1 extraout_var [56];
  
  ChLink::UpdateTime((ChLink *)this,mytime);
  local_2e0._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_2e0.coord.pos.m_data[0] = 0.0;
  local_2e0.coord.pos.m_data[1] = 0.0;
  local_2e0.coord.pos.m_data[2] = 0.0;
  local_258._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b03780;
  local_258.coord.pos.m_data[0] = 0.0;
  local_258.coord.pos.m_data[1] = 0.0;
  local_258.coord.pos.m_data[2] = 0.0;
  local_258.coord.rot.m_data[0] = 1.0;
  local_258.coord.rot.m_data[1] = 0.0;
  local_258.coord.rot.m_data[2] = 0.0;
  local_258.coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&local_258.Amatrix,(ChQuaternion<double> *)&local_2e0);
  local_2e0._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b03780;
  local_2e0.coord.pos.m_data[2] = 0.0;
  local_1d0._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_2e0.coord.pos.m_data[0] = 0.0;
  local_2e0.coord.pos.m_data[1] = 0.0;
  local_2e0.coord.rot.m_data[0] = 1.0;
  local_1d0.coord.pos.m_data[0] = 0.0;
  local_1d0.coord.pos.m_data[1] = 0.0;
  local_1d0.coord.pos.m_data[2] = 0.0;
  local_2e0.coord.rot.m_data[1] = 0.0;
  local_2e0.coord.rot.m_data[2] = 0.0;
  local_2e0.coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&local_2e0.Amatrix,(ChQuaternion<double> *)&local_1d0);
  ChFrame<double>::TransformLocalToParent
            ((ChFrame<double> *)(this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.Body1,
             &this->local_pinion,&local_258);
  ChFrame<double>::TransformLocalToParent
            ((ChFrame<double> *)(this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.Body2,
             &this->local_rack,&local_2e0);
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       local_258.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       local_258.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       local_2e0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       local_2e0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar36._8_8_ = 0;
  auVar36._0_8_ =
       local_2e0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar21 = ZEXT816(0) << 0x40;
  if (((local_258.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] !=
        0.0) || (NAN(local_258.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[2]))) ||
     (local_258.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] != 0.0)
     ) {
LAB_005aa34b:
    auVar18._8_8_ = 0;
    auVar18._0_8_ =
         local_258.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
         local_258.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar21 = vfmadd231sd_fma(auVar18,auVar16,auVar16);
    auVar21 = vfmadd231sd_fma(auVar21,auVar15,auVar15);
    auVar21 = vsqrtsd_avx(auVar21,auVar21);
    dVar32 = auVar21._0_8_;
    bVar12 = dVar32 == 2.2250738585072014e-308;
    bVar11 = 2.2250738585072014e-308 < dVar32;
    bVar2 = 2.2250738585072014e-308 <= dVar32;
    dVar32 = 1.0 / dVar32;
    local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         (double)((ulong)bVar2 *
                 (long)(local_258.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array[8] * dVar32));
    auVar21._8_8_ = 0;
    auVar21._0_8_ =
         (ulong)bVar2 *
         (long)(local_258.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [5] * dVar32);
    auVar13._0_8_ =
         (ulong)bVar2 *
         (long)(local_258.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [2] * dVar32) + (ulong)!bVar2 * 0x3ff0000000000000;
    auVar13._8_8_ = 0;
  }
  else {
    bVar12 = local_258.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8]
             == 0.0;
    bVar11 = local_258.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8]
             < 0.0;
    if ((!bVar12) ||
       (NAN(local_258.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8]))
       ) goto LAB_005aa34b;
    auVar13 = ZEXT816(0x3ff0000000000000);
    local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = 0.0;
  }
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       auVar13._0_8_;
  local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       auVar21._0_8_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = local_258.coord.pos.m_data[0];
  auVar29._8_8_ = 0;
  auVar29._0_8_ = local_258.coord.pos.m_data[1];
  auVar33._8_8_ = 0;
  auVar33._0_8_ = local_2e0.coord.pos.m_data[0];
  auVar39._8_8_ = 0;
  auVar39._0_8_ = local_2e0.coord.pos.m_data[1];
  auVar31._8_8_ = 0;
  auVar31._0_8_ = local_258.coord.pos.m_data[2];
  auVar42._8_8_ = 0;
  auVar42._0_8_ = local_2e0.coord.pos.m_data[2];
  auVar14 = vmovddup_avx512vl(ZEXT816(0x8000000000000000));
  auVar51._8_8_ = 0;
  auVar51._0_8_ =
       local_2e0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] *
       local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar15 = vfmsub231sd_fma(auVar51,auVar7,auVar17);
  auVar45._8_8_ = 0;
  auVar45._0_8_ =
       local_2e0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] *
       local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar16 = vfmsub231sd_fma(auVar45,auVar21,auVar36);
  local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       auVar16._0_8_;
  auVar48._8_8_ = 0;
  auVar48._0_8_ =
       local_2e0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] *
       local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar18 = vfmsub231sd_fma(auVar48,auVar13,auVar19);
  local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       auVar18._0_8_;
  local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       auVar15._0_8_;
  auVar54._8_8_ = 0;
  auVar54._0_8_ =
       local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] *
       local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar15 = vfmadd231sd_fma(auVar54,auVar16,auVar16);
  auVar15 = vfmadd231sd_fma(auVar15,auVar18,auVar18);
  auVar15 = vsqrtsd_avx(auVar15,auVar15);
  dVar32 = auVar15._0_8_;
  vucomisd_avx512f(auVar15);
  if (bVar11 || bVar12) goto LAB_005aa4c8;
  auVar4._8_8_ = 0x7fffffffffffffff;
  auVar4._0_8_ = 0x7fffffffffffffff;
  auVar15 = vandpd_avx512vl(auVar17,auVar4);
  auVar16 = vxorpd_avx512vl(auVar7,auVar14);
  auVar17 = vxorpd_avx512vl(auVar13,auVar14);
  auVar18 = vxorpd_avx512vl(auVar21,auVar14);
  dVar32 = auVar15._0_8_;
  bVar12 = dVar32 == 0.9;
  bVar11 = 0.9 < dVar32;
  if (0.9 <= dVar32) {
    auVar5._8_8_ = 0x7fffffffffffffff;
    auVar5._0_8_ = 0x7fffffffffffffff;
    auVar15 = vandpd_avx512vl(auVar19,auVar5);
    dVar32 = auVar15._0_8_;
    bVar12 = dVar32 == 0.9;
    bVar11 = 0.9 < dVar32;
    if (0.9 <= dVar32) {
      auVar6._8_8_ = 0x7fffffffffffffff;
      auVar6._0_8_ = 0x7fffffffffffffff;
      auVar15 = vandpd_avx512vl(auVar36,auVar6);
      auVar36 = ZEXT816(0);
      dVar32 = auVar15._0_8_;
      bVar12 = dVar32 == 0.9;
      bVar11 = 0.9 < dVar32;
      if (0.9 <= dVar32) goto LAB_005aa48e;
      auVar15 = ZEXT816(0x3ff0000000000000);
    }
    else {
      auVar36 = ZEXT816(0x3ff0000000000000);
LAB_005aa48e:
      auVar15 = ZEXT816(0);
    }
    auVar19 = ZEXT816(0);
  }
  else {
    auVar19 = ZEXT816(0x3ff0000000000000);
    auVar15 = ZEXT816(0);
    auVar36 = ZEXT816(0);
  }
  auVar52._8_8_ = 0;
  auVar52._0_8_ = auVar15._0_8_ * auVar17._0_8_;
  auVar17 = vfmadd231sd_fma(auVar52,auVar7,auVar19);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = auVar16._0_8_ * auVar36._0_8_;
  auVar15 = vfmadd231sd_fma(auVar46,auVar21,auVar15);
  local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       auVar15._0_8_;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = auVar19._0_8_ * auVar18._0_8_;
  auVar16 = vfmadd231sd_fma(auVar49,auVar13,auVar36);
  local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       auVar16._0_8_;
  local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       auVar17._0_8_;
  auVar37._8_8_ = 0;
  auVar37._0_8_ =
       local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] *
       local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar15 = vfmadd231sd_fma(auVar37,auVar15,auVar15);
  auVar15 = vfmadd231sd_fma(auVar15,auVar16,auVar16);
  auVar15 = vsqrtsd_avx(auVar15,auVar15);
  dVar32 = auVar15._0_8_;
LAB_005aa4c8:
  auVar19 = vsubsd_avx512f(auVar20,auVar33);
  auVar17 = vsubsd_avx512f(auVar29,auVar39);
  auVar18 = vsubsd_avx512f(auVar31,auVar42);
  dVar32 = 1.0 / dVar32;
  local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] *
       dVar32;
  local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] *
       dVar32;
  local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] *
       dVar32;
  auVar38._8_8_ = 0;
  auVar38._0_8_ =
       local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar15 = vmulsd_avx512f(auVar17,auVar38);
  auVar40._8_8_ = 0;
  auVar40._0_8_ =
       local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar20 = vfmadd231sd_avx512f(auVar15,auVar40,auVar19);
  auVar41._8_8_ = 0;
  auVar41._0_8_ =
       local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar15 = vfmsub231sd_fma(auVar41,auVar38,auVar7);
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar43._8_8_ = 0;
  auVar43._0_8_ =
       local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] *
       local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar16 = vfmsub231sd_fma(auVar43,auVar34,auVar13);
  auVar44._8_8_ = 0;
  auVar44._0_8_ =
       local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] *
       local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar36 = vfmsub231sd_fma(auVar44,auVar40,auVar21);
  auVar21 = vfmadd231sd_avx512f(auVar20,auVar34,auVar18);
  dVar27 = auVar21._0_8_;
  auVar53._8_8_ = 0;
  auVar53._0_8_ =
       dVar27 * local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [4];
  auVar21 = vmulsd_avx512f(auVar17,auVar53);
  auVar47._8_8_ = 0;
  auVar47._0_8_ =
       dVar27 * local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [7];
  auVar17 = vxorpd_avx512vl(auVar47,auVar14);
  auVar50._8_8_ = 0;
  auVar50._0_8_ =
       local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] *
       dVar27;
  auVar21 = vfmadd231sd_avx512f(auVar21,auVar50,auVar19);
  vfmadd231sd_avx512f(auVar21,auVar47,auVar18);
  auVar21 = vxorpd_avx512vl(auVar18,auVar18);
  vucomisd_avx512f(auVar21);
  auVar21 = vxorpd_avx512vl(auVar53,auVar14);
  auVar19 = vxorpd_avx512vl(auVar50,auVar14);
  bVar8 = !bVar11;
  bVar9 = !bVar12;
  bVar2 = bVar8 && bVar9;
  dVar32 = (double)((ulong)bVar2 * auVar21._0_8_ +
                   (ulong)(!bVar8 || !bVar9) *
                   (long)(dVar27 * local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                   m_storage.m_data.array[4]));
  auVar22._0_8_ =
       (double)((ulong)bVar2 * auVar19._0_8_ +
               (ulong)(!bVar8 || !bVar9) *
               (long)(local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array[1] * dVar27));
  auVar22._8_8_ = 0;
  auVar23._0_8_ =
       (double)((ulong)bVar2 * auVar17._0_8_ +
               (ulong)(!bVar8 || !bVar9) *
               (long)(dVar27 * local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array[7]));
  auVar23._8_8_ = 0;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar32 * dVar32;
  auVar21 = vfmadd231sd_fma(auVar55,auVar22,auVar22);
  auVar21 = vfmadd231sd_fma(auVar21,auVar23,auVar23);
  auVar21 = vsqrtsd_avx(auVar21,auVar21);
  vucomisd_avx512f(auVar21);
  auVar21 = vdivsd_avx512f(ZEXT816(0x3ff0000000000000),auVar21);
  bVar2 = bVar11 || bVar12;
  dVar27 = auVar21._0_8_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = (ulong)bVar2 * (long)(auVar23._0_8_ * dVar27);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = this->R;
  auVar21 = vmulsd_avx512f(auVar56,auVar24);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = (ulong)bVar2 * (long)(dVar32 * dVar27);
  auVar19 = vmulsd_avx512f(auVar56,auVar25);
  auVar26._0_8_ =
       (ulong)bVar2 * (long)(auVar22._0_8_ * dVar27) +
       (ulong)(!bVar11 && !bVar12) * 0x3ff0000000000000;
  auVar26._8_8_ = 0;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = this->R;
  auVar17 = vmulsd_avx512f(auVar57,auVar26);
  (this->contact_pt).m_data[0] = auVar17._0_8_ + local_258.coord.pos.m_data[0];
  (this->contact_pt).m_data[1] = auVar19._0_8_ + local_258.coord.pos.m_data[1];
  (this->contact_pt).m_data[2] = auVar21._0_8_ + local_258.coord.pos.m_data[2];
  local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       auVar15._0_8_;
  local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       auVar16._0_8_;
  local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       auVar36._0_8_;
  ChFrame<double>::ChFrame(&local_1d0,&this->contact_pt,&local_100);
  dVar32 = this->beta;
  dVar27 = cos(dVar32);
  dVar32 = sin(dVar32);
  local_2f8 = auVar14._0_8_;
  uStack_2f0 = auVar14._8_8_;
  auVar30._0_8_ = (ulong)dVar32 ^ local_2f8;
  auVar30._8_8_ = extraout_XMM0_Qb ^ uStack_2f0;
  local_148._24_8_ = dVar32 * 0.0;
  local_148._8_8_ = dVar27 * 0.0;
  local_148._16_8_ = vmovlpd_avx(auVar30);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = local_148._24_8_;
  auVar21 = vfmadd231sd_fma(ZEXT816(0x3ff0000000000000),auVar35,ZEXT816(0) << 0x40);
  local_148._32_8_ = auVar21._0_8_;
  dStack_110 = (double)local_148._24_8_;
  local_148._48_8_ = dVar32 + 0.0;
  local_148._0_8_ = dVar27;
  local_148._40_8_ = local_148._8_8_;
  local_108 = dVar27;
  ChFrame<double>::ChFrame(&local_b8,(ChVector<double> *)&VNULL,(ChMatrix33<double> *)local_148);
  ChFrame<double>::ConcatenatePostTransformation(&local_1d0,&local_b8);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.react_force.m_data[0]
  ;
  uVar3 = vcmpsd_avx512f(ZEXT816(0) << 0x40,auVar1,0xe);
  bVar12 = (bool)((byte)uVar3 & 1);
  dVar32 = (double)((ulong)bVar12 * (long)this->alpha +
                   (ulong)!bVar12 * ((ulong)this->alpha ^ local_2f8));
  dVar27 = cos(dVar32);
  auVar28._0_8_ = sin(dVar32);
  auVar28._8_56_ = extraout_var;
  auVar10._8_8_ = extraout_XMM0_Qb_00;
  auVar10._0_8_ = dVar27;
  auVar16 = auVar28._0_16_;
  auVar15 = vfmsub213sd_fma(ZEXT816(0) << 0x40,auVar10,auVar16);
  auVar21 = vfmadd213sd_fma(ZEXT816(0) << 0x40,auVar16,auVar10);
  local_148._16_8_ = -0.0;
  local_148._24_8_ = auVar15._0_8_;
  local_148._32_8_ = auVar21._0_8_;
  auVar21 = vunpcklpd_avx(ZEXT816(0) << 0x40,auVar14);
  auVar15 = vunpcklpd_avx(auVar16,auVar10);
  auVar16 = vunpcklpd_avx(auVar10,auVar16);
  local_148._40_8_ = 0.0;
  auVar14._0_8_ = auVar15._0_8_ * auVar21._0_8_;
  auVar14._8_8_ = auVar15._8_8_ * auVar21._8_8_;
  unique0x001c1500 = vfmadd213pd_fma(auVar16,ZEXT816(0) << 0x40,auVar14);
  local_108 = 1.0;
  local_148._0_8_ = dVar27;
  local_148._8_8_ = auVar28._0_8_;
  ChFrame<double>::SetRot(&local_b8,(ChMatrix33<double> *)local_148);
  ChFrame<double>::ConcatenatePostTransformation(&local_1d0,&local_b8);
  ChFrame<double>::TransformParentToLocal
            ((ChFrame<double> *)(this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.Body1,
             &local_1d0,&(this->super_ChLinkMateGeneric).frame1);
  ChFrame<double>::TransformParentToLocal
            ((ChFrame<double> *)(this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.Body2,
             &local_1d0,&(this->super_ChLinkMateGeneric).frame2);
  return;
}

Assistant:

void ChLinkRackpinion::UpdateTime(double mytime) {
    // First, inherit to parent class
    ChLinkMateGeneric::UpdateTime(mytime);

    ChFrame<double> abs_pinion;
    ChFrame<double> abs_rack;

    ((ChFrame<double>*)Body1)->TransformLocalToParent(local_pinion, abs_pinion);
    ((ChFrame<double>*)Body2)->TransformLocalToParent(local_rack, abs_rack);

    ChVector<> abs_distpr = abs_pinion.GetPos() - abs_rack.GetPos();
    ChVector<> abs_Dpin = abs_pinion.GetA().Get_A_Zaxis();
    ChVector<> abs_Dx;
    ChVector<> abs_Dy;
    ChVector<> abs_Dz;
    abs_Dpin.DirToDxDyDz(abs_Dz, abs_Dx, abs_Dy,
                         abs_rack.GetA().Get_A_Xaxis());  // with z as pinion shaft and x as suggested rack X dir

    /*
    GetLog() << "abs_distpr " << abs_distpr << "\n";
    GetLog() << "abs_rack Xaxis()" << abs_rack.GetA()->Get_A_Xaxis() << "\n";
    GetLog() << "abs_Dpin " << abs_Dpin << "\n";
    GetLog() << "abs_Dx " << abs_Dx << "\n";
    */

    ChVector<> abs_Ro = abs_Dy * Vdot(abs_Dy, abs_distpr);

    if (Vdot(abs_Ro, abs_distpr) > 0)
        abs_Ro = -abs_Ro;

    ChVector<> abs_Dr = abs_Ro.GetNormalized();
    ChVector<> abs_R = abs_Dr * this->GetPinionRadius();
    this->contact_pt = abs_pinion.GetPos() + abs_R;

    // Absolute frame of link reference
    ChMatrix33<> ma1(abs_Dx, abs_Dy, abs_Dz);
    ChFrame<> abs_contact(this->contact_pt, ma1);

    ChMatrix33<> mrot;

    // rotate link frame on its Y because of beta
    mrot.Set_A_Rxyz(ChVector<>(0, this->beta, 0));
    ChFrame<> mrotframe(VNULL, mrot);
    abs_contact.ConcatenatePostTransformation(mrotframe);  // or: abs_contact *= mrotframe;

    // rotate link frame on its Z because of alpha
    if (this->react_force.x() < 0)
        mrot.Set_A_Rxyz(ChVector<>(0, 0, this->alpha));
    else
        mrot.Set_A_Rxyz(ChVector<>(0, 0, -this->alpha));
    mrotframe.SetRot(mrot);
    abs_contact.ConcatenatePostTransformation(mrotframe);  // or: abs_contact *= mrotframe;

    // Set the link frame 'abs_contact' to relative frames to the two connected ChBodyFrame
    ((ChFrame<double>*)Body1)->TransformParentToLocal(abs_contact, this->frame1);
    ((ChFrame<double>*)Body2)->TransformParentToLocal(abs_contact, this->frame2);
}